

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

void __thiscall Fl_Preferences::Node::add(Node *this,char *line)

{
  Entry *pEVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  
  lVar5 = (long)lastEntrySet;
  if ((-1 < lVar5) && (lastEntrySet < this->nEntry_)) {
    pEVar1 = this->entry_;
    pcVar4 = pEVar1[lVar5].value;
    sVar2 = strlen(pcVar4);
    sVar3 = strlen(line);
    pcVar4 = (char *)realloc(pcVar4,sVar3 + sVar2 + 1);
    pEVar1[lVar5].value = pcVar4;
    memcpy(pcVar4 + sVar2,line,sVar3 + 1);
    this->field_0x30 = this->field_0x30 | 1;
  }
  return;
}

Assistant:

void Fl_Preferences::Node::add( const char *line ) {
  if ( lastEntrySet<0 || lastEntrySet>=nEntry_ ) return;
  char *&dst = entry_[ lastEntrySet ].value;
  size_t a = strlen( dst );
  size_t b = strlen( line );
  dst = (char*)realloc( dst, a+b+1 );
  memcpy( dst+a, line, b+1 );
  dirty_ = 1;
}